

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickcdef.c
# Opt level: O0

uint64_t search_one_dual(int *lev0,int *lev1,int nb_strengths,uint64_t (**mse) [64],int sb_count,
                        CDEF_PICK_METHOD pick_method)

{
  int iVar1;
  ulong uVar2;
  long *in_RCX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  uint in_R9D;
  int k_1;
  uint64_t curr_1;
  uint64_t best;
  int k;
  uint64_t curr;
  uint64_t best_mse;
  int gi;
  int total_strengths;
  int best_id1;
  int best_id0;
  uint64_t best_tot_mse;
  int j;
  int i;
  uint64_t tot_mse [64] [64];
  int local_8074;
  ulong local_8068;
  int local_805c;
  ulong local_8050;
  int local_8048;
  int local_8040;
  int local_803c;
  uint64_t local_8038;
  int local_8030;
  int local_802c;
  ulong local_8028 [4096];
  int local_24;
  long *local_20;
  int local_14;
  long local_10;
  long local_8;
  
  local_8038 = 0x8000000000000000;
  local_803c = 0;
  local_8040 = 0;
  iVar1 = nb_cdef_strengths[in_R9D];
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(local_8028,0,0x8000);
  for (local_802c = 0; local_802c < local_24; local_802c = local_802c + 1) {
    local_8050 = 0x8000000000000000;
    for (local_8048 = 0; local_8048 < local_14; local_8048 = local_8048 + 1) {
      uVar2 = *(long *)(local_20[1] + (long)local_802c * 0x200 +
                       (long)*(int *)(local_10 + (long)local_8048 * 4) * 8) +
              *(long *)(*local_20 + (long)local_802c * 0x200 +
                       (long)*(int *)(local_8 + (long)local_8048 * 4) * 8);
      if (uVar2 < local_8050) {
        local_8050 = uVar2;
      }
    }
    for (local_8030 = 0; local_8030 < iVar1; local_8030 = local_8030 + 1) {
      for (local_805c = 0; local_805c < iVar1; local_805c = local_805c + 1) {
        local_8068 = local_8050;
        uVar2 = *(long *)(local_20[1] + (long)local_802c * 0x200 + (long)local_805c * 8) +
                *(long *)(*local_20 + (long)local_802c * 0x200 + (long)local_8030 * 8);
        if (uVar2 < local_8050) {
          local_8068 = uVar2;
        }
        local_8028[(long)local_8030 * 0x40 + (long)local_805c] =
             local_8068 + local_8028[(long)local_8030 * 0x40 + (long)local_805c];
      }
    }
  }
  for (local_8030 = 0; local_8030 < iVar1; local_8030 = local_8030 + 1) {
    for (local_8074 = 0; local_8074 < iVar1; local_8074 = local_8074 + 1) {
      if (local_8028[(long)local_8030 * 0x40 + (long)local_8074] < local_8038) {
        local_8038 = local_8028[(long)local_8030 * 0x40 + (long)local_8074];
        local_803c = local_8030;
        local_8040 = local_8074;
      }
    }
  }
  *(int *)(local_8 + (long)local_14 * 4) = local_803c;
  *(int *)(local_10 + (long)local_14 * 4) = local_8040;
  return local_8038;
}

Assistant:

static uint64_t search_one_dual(int *lev0, int *lev1, int nb_strengths,
                                uint64_t (**mse)[TOTAL_STRENGTHS], int sb_count,
                                CDEF_PICK_METHOD pick_method) {
  uint64_t tot_mse[TOTAL_STRENGTHS][TOTAL_STRENGTHS];
  int i, j;
  uint64_t best_tot_mse = (uint64_t)1 << 63;
  int best_id0 = 0;
  int best_id1 = 0;
  const int total_strengths = nb_cdef_strengths[pick_method];
  memset(tot_mse, 0, sizeof(tot_mse));
  for (i = 0; i < sb_count; i++) {
    int gi;
    uint64_t best_mse = (uint64_t)1 << 63;
    /* Find best mse among already selected options. */
    for (gi = 0; gi < nb_strengths; gi++) {
      uint64_t curr = mse[0][i][lev0[gi]];
      curr += mse[1][i][lev1[gi]];
      if (curr < best_mse) {
        best_mse = curr;
      }
    }
    /* Find best mse when adding each possible new option. */
    for (j = 0; j < total_strengths; j++) {
      int k;
      for (k = 0; k < total_strengths; k++) {
        uint64_t best = best_mse;
        uint64_t curr = mse[0][i][j];
        curr += mse[1][i][k];
        if (curr < best) best = curr;
        tot_mse[j][k] += best;
      }
    }
  }
  for (j = 0; j < total_strengths; j++) {
    int k;
    for (k = 0; k < total_strengths; k++) {
      if (tot_mse[j][k] < best_tot_mse) {
        best_tot_mse = tot_mse[j][k];
        best_id0 = j;
        best_id1 = k;
      }
    }
  }
  lev0[nb_strengths] = best_id0;
  lev1[nb_strengths] = best_id1;
  return best_tot_mse;
}